

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::GenerateByteSize(Map *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  Sub *local_180;
  basic_string_view<char,_std::char_traits<char>_> local_158;
  undefined1 local_141;
  anon_class_16_2_fd512ddd_for_cb local_140 [2];
  allocator<char> local_119;
  string local_118;
  Sub *local_f8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  Map *this_local;
  
  local_141 = 1;
  local_f8 = &local_f0;
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"Funcs",&local_119);
  local_140[0].p = (Printer **)local_18;
  local_140[0].this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::(anonymous_namespace)::Map::GenerateByteSize(google::protobuf::io::Printer*)const::__0>
            (&local_f0,&local_118,local_140);
  local_141 = 0;
  local_38 = &local_f0;
  local_30 = 1;
  v._M_len = 1;
  v._M_array = local_38;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_158,
             "\n        total_size +=\n            $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$_size());\n        for (const auto& entry : this_._internal_$name$()) {\n          total_size += $Funcs$::ByteSizeLong(entry.first, entry.second);\n        }\n      "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (p,local_28._M_allocated_capacity,local_28._8_8_,local_158._M_len,local_158._M_str);
  local_180 = (Sub *)&local_38;
  do {
    local_180 = local_180 + -1;
    io::Printer::Sub::~Sub(local_180);
  } while (local_180 != &local_f0);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator(&local_119);
  return;
}

Assistant:

void Map::GenerateByteSize(io::Printer* p) const {
  p->Emit(
      {
          {"Funcs", [&] { EmitFuncs(field_, p); }},
      },
      R"cc(
        total_size +=
            $kTagBytes$ * $pbi$::FromIntSize(this_._internal_$name$_size());
        for (const auto& entry : this_._internal_$name$()) {
          total_size += $Funcs$::ByteSizeLong(entry.first, entry.second);
        }
      )cc");
}